

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

bool __thiscall
glslang::TInputScanner::scanVersion
          (TInputScanner *this,int *version,EProfile *profile,bool *notFirstToken)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  EProfile EVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  byte unaff_BPL;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  byte bVar12;
  bool foundNonSpaceTab;
  char profileString [13];
  bool local_56;
  short local_55;
  undefined2 uStack_53;
  undefined4 uStack_51;
  undefined5 uStack_4d;
  EProfile *local_48;
  int *local_40;
  bool *local_38;
  
  *notFirstToken = false;
  *version = 0;
  *profile = ENoProfile;
  local_56 = false;
  bVar7 = false;
  local_48 = profile;
  local_40 = version;
  local_38 = notFirstToken;
  bVar11 = 0;
LAB_0043f856:
  do {
    do {
      bVar12 = bVar11;
      if (bVar7) {
        *local_38 = true;
        iVar2 = this->currentSource;
        lVar3 = (long)iVar2;
        iVar8 = this->numSources;
        if (iVar2 < iVar8) {
          sVar10 = this->currentChar;
          lVar5 = lVar3;
          do {
            if (sVar10 < this->lengths[lVar5]) {
              if (this->sources[lVar5][sVar10] == '\n') goto LAB_0043f8f3;
              break;
            }
            lVar5 = lVar5 + 1;
            sVar10 = 0;
          } while (iVar8 != lVar5);
        }
        else {
          this->endOfFileReached = true;
        }
        if (iVar2 < iVar8) {
          uVar9 = this->currentChar;
          do {
            if (uVar9 < this->lengths[lVar3]) {
              if (this->sources[lVar3][uVar9] == '\r') goto LAB_0043f8f3;
              break;
            }
            lVar3 = lVar3 + 1;
            uVar9 = 0;
          } while (iVar8 != lVar3);
        }
        else {
          this->endOfFileReached = true;
        }
        do {
          do {
            iVar2 = get(this);
          } while (0xe < iVar2 + 1U);
        } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
LAB_0043f8f3:
        iVar2 = this->currentSource;
        lVar3 = (long)iVar2;
        iVar8 = this->numSources;
        lVar5 = (long)iVar8;
        if (iVar2 < iVar8) {
          sVar10 = this->currentChar;
          lVar6 = lVar3;
          do {
            if (sVar10 < this->lengths[lVar6]) {
              if (this->sources[lVar6][sVar10] == '\n') goto LAB_0043f966;
              break;
            }
            lVar6 = lVar6 + 1;
            sVar10 = 0;
          } while (lVar5 != lVar6);
        }
        else {
          this->endOfFileReached = true;
        }
        if (iVar2 < iVar8) {
          sVar10 = this->currentChar;
          lVar6 = lVar3;
          while (this->lengths[lVar6] <= sVar10) {
            lVar6 = lVar6 + 1;
            sVar10 = 0;
            if (lVar5 == lVar6) goto LAB_0043f975;
          }
          if (this->sources[lVar6][sVar10] != '\r') goto LAB_0043f975;
LAB_0043f966:
          get(this);
          goto LAB_0043f8f3;
        }
        this->endOfFileReached = true;
LAB_0043f975:
        if (iVar8 <= iVar2) {
          this->endOfFileReached = true;
LAB_0043fbd6:
          unaff_BPL = 1;
          goto LAB_0043fbd9;
        }
        uVar9 = this->currentChar;
        while (this->lengths[lVar3] <= uVar9) {
          lVar3 = lVar3 + 1;
          uVar9 = 0;
          if (lVar5 == lVar3) goto LAB_0043fbd6;
        }
      }
      consumeWhitespaceComment(this,&local_56);
      if (local_56 != false) {
        bVar12 = 1;
      }
      iVar2 = get(this);
      bVar7 = true;
      bVar11 = 1;
    } while (iVar2 != 0x23);
    do {
      do {
        iVar2 = get(this);
      } while (iVar2 == 9);
    } while (iVar2 == 0x20);
    if (iVar2 != 0x76) {
      bVar7 = true;
      bVar11 = 1;
      goto LAB_0043f856;
    }
    iVar2 = get(this);
    bVar7 = true;
    bVar11 = 1;
    if (iVar2 == 0x65) {
      iVar2 = get(this);
      bVar7 = true;
      bVar11 = 1;
      if (iVar2 == 0x72) {
        iVar2 = get(this);
        bVar7 = true;
        bVar11 = 1;
        if (iVar2 == 0x73) {
          iVar2 = get(this);
          bVar7 = true;
          bVar11 = 1;
          if (iVar2 == 0x69) {
            iVar2 = get(this);
            bVar7 = true;
            bVar11 = 1;
            if (iVar2 == 0x6f) {
              iVar2 = get(this);
              bVar7 = true;
              bVar11 = 1;
              if (iVar2 == 0x6e) {
                do {
                  do {
                    iVar2 = get(this);
                    piVar1 = local_40;
                  } while (iVar2 == 9);
                } while (iVar2 == 0x20);
                while (iVar2 - 0x30U < 10) {
                  *piVar1 = (iVar2 - 0x30U) + *piVar1 * 10;
                  iVar2 = get(this);
                }
                bVar7 = true;
                bVar11 = 1;
                if (*piVar1 != 0) {
                  while ((iVar2 == 0x20 || (iVar2 == 9))) {
                    iVar2 = get(this);
                  }
                  lVar3 = 0;
                  do {
                    if ((iVar2 + 1U < 0x22) &&
                       ((0x200004c01U >> ((ulong)(iVar2 + 1U) & 0x3f) & 1) != 0)) goto LAB_0043fb36;
                    *(char *)((long)&local_55 + lVar3) = (char)iVar2;
                    iVar2 = get(this);
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 0xd);
                  bVar11 = 1;
                  if ((iVar2 + 1U < 0x22) &&
                     (lVar3 = 0xd, (0x200004c01U >> ((ulong)(iVar2 + 1U) & 0x3f) & 1) != 0)) {
LAB_0043fb36:
                    iVar8 = (int)lVar3;
                    unaff_BPL = bVar12;
                    bVar11 = bVar12;
                    if (iVar8 == 0xd) {
                      if (CONCAT53(uStack_4d,uStack_51._1_3_) == 0x7974696c69626974 &&
                          CONCAT44(uStack_51,CONCAT22(uStack_53,local_55)) == 0x62697461706d6f63) {
                        EVar4 = ECompatibilityProfile;
                        goto LAB_0043fba3;
                      }
                    }
                    else if (iVar8 == 4) {
                      if (CONCAT22(uStack_53,local_55) == 0x65726f63) {
                        EVar4 = ECoreProfile;
                        goto LAB_0043fba3;
                      }
                    }
                    else if ((iVar8 == 2) && (local_55 == 0x7365)) {
                      EVar4 = EEsProfile;
LAB_0043fba3:
                      *local_48 = EVar4;
                    }
                  }
                  if ((iVar2 + 1U < 0x22) &&
                     ((0x200004c01U >> ((ulong)(iVar2 + 1U) & 0x3f) & 1) != 0)) {
LAB_0043fbd9:
                    return (bool)(unaff_BPL & 1);
                  }
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool TInputScanner::scanVersion(int& version, EProfile& profile, bool& notFirstToken)
{
    // This function doesn't have to get all the semantics correct,
    // just find the #version if there is a correct one present.
    // The preprocessor will have the responsibility of getting all the semantics right.

    bool versionNotFirst = false;  // means not first WRT comments and white space, nothing more
    notFirstToken = false;         // means not first WRT to real tokens
    version = 0;                   // means not found
    profile = ENoProfile;

    bool foundNonSpaceTab = false;
    bool lookingInMiddle = false;
    int c;
    do {
        if (lookingInMiddle) {
            notFirstToken = true;
            // make forward progress by finishing off the current line plus extra new lines
            if (peek() != '\n' && peek() != '\r') {
                do {
                    c = get();
                } while (c != EndOfInput && c != '\n' && c != '\r');
            }
            while (peek() == '\n' || peek() == '\r')
                get();
            if (peek() == EndOfInput)
                return true;
        }
        lookingInMiddle = true;

        // Nominal start, skipping the desktop allowed comments and white space, but tracking if
        // something else was found for ES:
        consumeWhitespaceComment(foundNonSpaceTab);
        if (foundNonSpaceTab)
            versionNotFirst = true;

        // "#"
        if (get() != '#') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // "version"
        if (    c != 'v' ||
            get() != 'e' ||
            get() != 'r' ||
            get() != 's' ||
            get() != 'i' ||
            get() != 'o' ||
            get() != 'n') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // version number
        while (c >= '0' && c <= '9') {
            version = 10 * version + (c - '0');
            c = get();
        }
        if (version == 0) {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        while (c == ' ' || c == '\t')
            c = get();

        // profile
        const int maxProfileLength = 13;  // not including any 0
        char profileString[maxProfileLength];
        int profileLength;
        for (profileLength = 0; profileLength < maxProfileLength; ++profileLength) {
            if (c == EndOfInput || c == ' ' || c == '\t' || c == '\n' || c == '\r')
                break;
            profileString[profileLength] = (char)c;
            c = get();
        }
        if (c != EndOfInput && c != ' ' && c != '\t' && c != '\n' && c != '\r') {
            versionNotFirst = true;
            continue;
        }

        if (profileLength == 2 && strncmp(profileString, "es", profileLength) == 0)
            profile = EEsProfile;
        else if (profileLength == 4 && strncmp(profileString, "core", profileLength) == 0)
            profile = ECoreProfile;
        else if (profileLength == 13 && strncmp(profileString, "compatibility", profileLength) == 0)
            profile = ECompatibilityProfile;

        return versionNotFirst;
    } while (true);
}